

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_util.c
# Opt level: O2

timeval tvnow(void)

{
  int iVar1;
  timespec *__tv;
  timeval tVar2;
  timespec tsnow;
  timeval local_18;
  
  __tv = &tsnow;
  iVar1 = clock_gettime(1,(timespec *)&tsnow);
  if (iVar1 == 0) {
    local_18.tv_usec = (__suseconds_t)(int)(tsnow.tv_nsec / 1000);
  }
  else {
    __tv = (timespec *)&local_18;
    gettimeofday((timeval *)__tv,(__timezone_ptr_t)0x0);
  }
  tVar2.tv_usec = local_18.tv_usec;
  tVar2.tv_sec = ((timeval *)__tv)->tv_sec;
  return tVar2;
}

Assistant:

struct timeval tvnow(void)
{
  /*
  ** clock_gettime() is granted to be increased monotonically when the
  ** monotonic clock is queried. Time starting point is unspecified, it
  ** could be the system start-up time, the Epoch, or something else,
  ** in any case the time starting point does not change once that the
  ** system has started up.
  */
  struct timeval now;
  struct timespec tsnow;
  if(0 == clock_gettime(CLOCK_MONOTONIC, &tsnow)) {
    now.tv_sec = tsnow.tv_sec;
    now.tv_usec = (int)(tsnow.tv_nsec / 1000);
  }
  /*
  ** Even when the configure process has truly detected monotonic clock
  ** availability, it might happen that it is not actually available at
  ** run-time. When this occurs simply fallback to other time source.
  */
#ifdef HAVE_GETTIMEOFDAY
  else
    (void)gettimeofday(&now, NULL);
#else
  else {
    now.tv_sec = (long)time(NULL);
    now.tv_usec = 0;
  }
#endif
  return now;
}